

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::ConsoleReporter::printHelp(ConsoleReporter *this)

{
  ostream *poVar1;
  ostream *poVar2;
  ostream *poVar3;
  ostream *poVar4;
  ostream *poVar5;
  long in_RDI;
  int sizePrefixDisplay;
  undefined8 in_stack_fffffffffffffde8;
  Enum EVar6;
  ConsoleReporter *in_stack_fffffffffffffdf0;
  Whitespace *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  Whitespace local_b8;
  Whitespace local_b4;
  Whitespace local_b0;
  Whitespace local_ac;
  Whitespace local_a8;
  Whitespace local_a4;
  Whitespace local_a0;
  Whitespace local_9c;
  Whitespace local_98;
  Whitespace local_94;
  Whitespace local_90;
  Whitespace local_8c;
  Whitespace local_88;
  Whitespace local_84;
  Whitespace local_80;
  Whitespace local_7c;
  Whitespace local_78;
  Whitespace local_74;
  Whitespace local_70;
  Whitespace local_6c;
  Whitespace local_68;
  Whitespace local_64;
  Whitespace local_60;
  Whitespace local_5c;
  Whitespace local_58;
  Whitespace local_54;
  Whitespace local_50;
  Whitespace local_4c;
  Whitespace local_48;
  Whitespace local_44;
  Whitespace local_40;
  Whitespace local_3c;
  Whitespace local_38;
  Whitespace local_34;
  Whitespace local_30;
  Whitespace local_2c;
  Whitespace local_28;
  Whitespace local_24;
  Whitespace local_20;
  Whitespace local_1c;
  Whitespace local_18;
  Whitespace local_14;
  Whitespace local_10;
  int local_c;
  
  local_c = 0;
  printVersion(in_stack_fffffffffffffdf0);
  EVar6 = (Enum)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest]\n");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest] ");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "boolean values: \"1/on/yes/true\" or \"0/off/no/false\"\n");
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest] ");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "filter  values: \"str1,str2,str3\" (comma separated strings)\n");
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest]\n");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest] ");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(*(ostream **)(in_RDI + 8),"filters use wildcards for matching strings\n");
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest] ");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "something passes a filter if any of the strings in a filter matches\n");
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest]\n");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest] ");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "ALL FLAGS, OPTIONS AND FILTERS ALSO AVAILABLE WITH A \"dt-\" PREFIX!!!\n");
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest]\n");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  poVar1 = Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(poVar1,"[doctest] ");
  Color::operator<<((ostream *)in_stack_fffffffffffffdf0,EVar6);
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "Query flags - the program quits after them. Available:\n\n");
  poVar1 = std::operator<<(*(ostream **)(in_RDI + 8)," -?,   --help, -h                      ");
  Whitespace::Whitespace(&local_10,0);
  poVar2 = anon_unknown_14::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::operator<<(poVar2,"prints this message\n");
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 8)," -v,   --version                       ");
  Whitespace::Whitespace(&local_14,local_c);
  poVar3 = anon_unknown_14::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::operator<<(poVar3,"prints the version\n");
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 8)," -c,   --count                         ");
  Whitespace::Whitespace(&local_18,local_c);
  poVar4 = anon_unknown_14::operator<<(in_stack_fffffffffffffe00,(Whitespace *)poVar3);
  std::operator<<(poVar4,"prints the number of matching tests\n");
  poVar4 = std::operator<<(*(ostream **)(in_RDI + 8)," -ltc, --list-test-cases               ");
  Whitespace::Whitespace(&local_1c,local_c);
  poVar5 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar5,"lists all matching tests by name\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -lts, --list-test-suites              ");
  Whitespace::Whitespace(&local_20,local_c);
  poVar5 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar5,"lists all matching test suites\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -lr,  --list-reporters                ");
  Whitespace::Whitespace(&local_24,local_c);
  poVar5 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar5,"lists all registered reporters\n\n");
  EVar6 = (Enum)((ulong)poVar1 >> 0x20);
  poVar1 = Color::operator<<(poVar2,EVar6);
  std::operator<<(poVar1,"[doctest] ");
  Color::operator<<(poVar2,EVar6);
  std::operator<<(*(ostream **)(in_RDI + 8),"The available <int>/<string> options/filters are:\n\n")
  ;
  std::operator<<(*(ostream **)(in_RDI + 8)," -tc,  --test-case=<filters>           ");
  Whitespace::Whitespace(&local_28,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"filters     tests by their name\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -tce, --test-case-exclude=<filters>   ");
  Whitespace::Whitespace(&local_2c,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"filters OUT tests by their name\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -sf,  --source-file=<filters>         ");
  Whitespace::Whitespace(&local_30,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"filters     tests by their file\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -sfe, --source-file-exclude=<filters> ");
  Whitespace::Whitespace(&local_34,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"filters OUT tests by their file\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -ts,  --test-suite=<filters>          ");
  Whitespace::Whitespace(&local_38,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"filters     tests by their test suite\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -tse, --test-suite-exclude=<filters>  ");
  Whitespace::Whitespace(&local_3c,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"filters OUT tests by their test suite\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -sc,  --subcase=<filters>             ");
  Whitespace::Whitespace(&local_40,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"filters     subcases by their name\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -sce, --subcase-exclude=<filters>     ");
  Whitespace::Whitespace(&local_44,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"filters OUT subcases by their name\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -r,   --reporters=<filters>           ");
  Whitespace::Whitespace(&local_48,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"reporters to use (console is default)\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -o,   --out=<string>                  ");
  Whitespace::Whitespace(&local_4c,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"output filename\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -ob,  --order-by=<string>             ");
  Whitespace::Whitespace(&local_50,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"how the tests should be ordered\n");
  Whitespace::Whitespace(&local_54,local_c * 3);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,
                  "                                       <string> - [file/suite/name/rand/none]\n")
  ;
  std::operator<<(*(ostream **)(in_RDI + 8)," -rs,  --rand-seed=<int>               ");
  Whitespace::Whitespace(&local_58,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"seed for random ordering\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -f,   --first=<int>                   ");
  Whitespace::Whitespace(&local_5c,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"the first test passing the filters to\n");
  Whitespace::Whitespace(&local_60,local_c * 3);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,
                  "                                       execute - for range-based execution\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -l,   --last=<int>                    ");
  Whitespace::Whitespace(&local_64,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"the last test passing the filters to\n");
  Whitespace::Whitespace(&local_68,local_c * 3);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,
                  "                                       execute - for range-based execution\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -aa,  --abort-after=<int>             ");
  Whitespace::Whitespace(&local_6c,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"stop after <int> failed assertions\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -scfl,--subcase-filter-levels=<int>   ");
  Whitespace::Whitespace(&local_70,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"apply filters for the first <int> levels\n");
  poVar1 = Color::operator<<(poVar2,EVar6);
  std::operator<<(poVar1,"\n[doctest] ");
  Color::operator<<(poVar2,EVar6);
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "Bool options - can be used like flags and true is assumed. Available:\n\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -s,   --success=<bool>                ");
  Whitespace::Whitespace(&local_74,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"include successful assertions in output\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -cs,  --case-sensitive=<bool>         ");
  Whitespace::Whitespace(&local_78,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"filters being treated as case sensitive\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -e,   --exit=<bool>                   ");
  Whitespace::Whitespace(&local_7c,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"exits after the tests finish\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -d,   --duration=<bool>               ");
  Whitespace::Whitespace(&local_80,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"prints the time duration of each test\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -m,   --minimal=<bool>                ");
  Whitespace::Whitespace(&local_84,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"minimal console output (only failures)\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -q,   --quiet=<bool>                  ");
  Whitespace::Whitespace(&local_88,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"no console output\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -nt,  --no-throw=<bool>               ");
  Whitespace::Whitespace(&local_8c,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"skips exceptions-related assert checks\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -ne,  --no-exitcode=<bool>            ");
  Whitespace::Whitespace(&local_90,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"returns (or exits) always with success\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -nr,  --no-run=<bool>                 ");
  Whitespace::Whitespace(&local_94,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"skips all runtime doctest operations\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -ni,  --no-intro=<bool>               ");
  Whitespace::Whitespace(&local_98,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"omit the framework intro in the output\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -nv,  --no-version=<bool>             ");
  Whitespace::Whitespace(&local_9c,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"omit the framework version in the output\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -nc,  --no-colors=<bool>              ");
  Whitespace::Whitespace(&local_a0,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"disables colors in output\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -fc,  --force-colors=<bool>           ");
  Whitespace::Whitespace(&local_a4,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"use colors even when not in a tty\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -nb,  --no-breaks=<bool>              ");
  Whitespace::Whitespace(&local_a8,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"disables breakpoints in debuggers\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -ns,  --no-skip=<bool>                ");
  Whitespace::Whitespace(&local_ac,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"don\'t skip test cases marked as skip\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -gfl, --gnu-file-line=<bool>          ");
  Whitespace::Whitespace(&local_b0,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,":n: vs (n): for line numbers in output\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -npf, --no-path-filenames=<bool>      ");
  Whitespace::Whitespace(&local_b4,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"only filenames and no paths in output\n");
  std::operator<<(*(ostream **)(in_RDI + 8)," -nln, --no-line-numbers=<bool>        ");
  Whitespace::Whitespace(&local_b8,local_c);
  poVar1 = anon_unknown_14::operator<<(poVar4,(Whitespace *)poVar3);
  std::operator<<(poVar1,"0 instead of real line numbers in output\n");
  poVar1 = Color::operator<<(poVar2,EVar6);
  std::operator<<(poVar1,"\n[doctest] ");
  Color::operator<<(poVar2,EVar6);
  std::operator<<(*(ostream **)(in_RDI + 8),
                  "for more information visit the project documentation\n\n");
  return;
}

Assistant:

void printHelp() {
            int sizePrefixDisplay = static_cast<int>(strlen(DOCTEST_OPTIONS_PREFIX_DISPLAY));
            printVersion();
            // clang-format off
            s << Color::Cyan << "[doctest]\n" << Color::None;
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "boolean values: \"1/on/yes/true\" or \"0/off/no/false\"\n";
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "filter  values: \"str1,str2,str3\" (comma separated strings)\n";
            s << Color::Cyan << "[doctest]\n" << Color::None;
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "filters use wildcards for matching strings\n";
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "something passes a filter if any of the strings in a filter matches\n";
#ifndef DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
            s << Color::Cyan << "[doctest]\n" << Color::None;
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "ALL FLAGS, OPTIONS AND FILTERS ALSO AVAILABLE WITH A \"" DOCTEST_CONFIG_OPTIONS_PREFIX "\" PREFIX!!!\n";
#endif
            s << Color::Cyan << "[doctest]\n" << Color::None;
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "Query flags - the program quits after them. Available:\n\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "?,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "help, -" DOCTEST_OPTIONS_PREFIX_DISPLAY "h                      "
              << Whitespace(sizePrefixDisplay*0) <<  "prints this message\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "v,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "version                       "
              << Whitespace(sizePrefixDisplay*1) << "prints the version\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "c,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "count                         "
              << Whitespace(sizePrefixDisplay*1) << "prints the number of matching tests\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ltc, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "list-test-cases               "
              << Whitespace(sizePrefixDisplay*1) << "lists all matching tests by name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "lts, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "list-test-suites              "
              << Whitespace(sizePrefixDisplay*1) << "lists all matching test suites\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "lr,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "list-reporters                "
              << Whitespace(sizePrefixDisplay*1) << "lists all registered reporters\n\n";
            // ================================================================================== << 79
            s << Color::Cyan << "[doctest] " << Color::None;
            s << "The available <int>/<string> options/filters are:\n\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "tc,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "test-case=<filters>           "
              << Whitespace(sizePrefixDisplay*1) << "filters     tests by their name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "tce, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "test-case-exclude=<filters>   "
              << Whitespace(sizePrefixDisplay*1) << "filters OUT tests by their name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "sf,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "source-file=<filters>         "
              << Whitespace(sizePrefixDisplay*1) << "filters     tests by their file\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "sfe, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "source-file-exclude=<filters> "
              << Whitespace(sizePrefixDisplay*1) << "filters OUT tests by their file\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ts,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "test-suite=<filters>          "
              << Whitespace(sizePrefixDisplay*1) << "filters     tests by their test suite\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "tse, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "test-suite-exclude=<filters>  "
              << Whitespace(sizePrefixDisplay*1) << "filters OUT tests by their test suite\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "sc,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "subcase=<filters>             "
              << Whitespace(sizePrefixDisplay*1) << "filters     subcases by their name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "sce, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "subcase-exclude=<filters>     "
              << Whitespace(sizePrefixDisplay*1) << "filters OUT subcases by their name\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "r,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "reporters=<filters>           "
              << Whitespace(sizePrefixDisplay*1) << "reporters to use (console is default)\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "o,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "out=<string>                  "
              << Whitespace(sizePrefixDisplay*1) << "output filename\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ob,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "order-by=<string>             "
              << Whitespace(sizePrefixDisplay*1) << "how the tests should be ordered\n";
            s << Whitespace(sizePrefixDisplay*3) << "                                       <string> - [file/suite/name/rand/none]\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "rs,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "rand-seed=<int>               "
              << Whitespace(sizePrefixDisplay*1) << "seed for random ordering\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "f,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "first=<int>                   "
              << Whitespace(sizePrefixDisplay*1) << "the first test passing the filters to\n";
            s << Whitespace(sizePrefixDisplay*3) << "                                       execute - for range-based execution\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "l,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "last=<int>                    "
              << Whitespace(sizePrefixDisplay*1) << "the last test passing the filters to\n";
            s << Whitespace(sizePrefixDisplay*3) << "                                       execute - for range-based execution\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "aa,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "abort-after=<int>             "
              << Whitespace(sizePrefixDisplay*1) << "stop after <int> failed assertions\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "scfl,--" DOCTEST_OPTIONS_PREFIX_DISPLAY "subcase-filter-levels=<int>   "
              << Whitespace(sizePrefixDisplay*1) << "apply filters for the first <int> levels\n";
            s << Color::Cyan << "\n[doctest] " << Color::None;
            s << "Bool options - can be used like flags and true is assumed. Available:\n\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "s,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "success=<bool>                "
              << Whitespace(sizePrefixDisplay*1) << "include successful assertions in output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "cs,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "case-sensitive=<bool>         "
              << Whitespace(sizePrefixDisplay*1) << "filters being treated as case sensitive\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "e,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "exit=<bool>                   "
              << Whitespace(sizePrefixDisplay*1) << "exits after the tests finish\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "d,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "duration=<bool>               "
              << Whitespace(sizePrefixDisplay*1) << "prints the time duration of each test\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "m,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "minimal=<bool>                "
              << Whitespace(sizePrefixDisplay*1) << "minimal console output (only failures)\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "q,   --" DOCTEST_OPTIONS_PREFIX_DISPLAY "quiet=<bool>                  "
              << Whitespace(sizePrefixDisplay*1) << "no console output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nt,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-throw=<bool>               "
              << Whitespace(sizePrefixDisplay*1) << "skips exceptions-related assert checks\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ne,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-exitcode=<bool>            "
              << Whitespace(sizePrefixDisplay*1) << "returns (or exits) always with success\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nr,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-run=<bool>                 "
              << Whitespace(sizePrefixDisplay*1) << "skips all runtime doctest operations\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ni,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-intro=<bool>               "
              << Whitespace(sizePrefixDisplay*1) << "omit the framework intro in the output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nv,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-version=<bool>             "
              << Whitespace(sizePrefixDisplay*1) << "omit the framework version in the output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nc,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-colors=<bool>              "
              << Whitespace(sizePrefixDisplay*1) << "disables colors in output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "fc,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "force-colors=<bool>           "
              << Whitespace(sizePrefixDisplay*1) << "use colors even when not in a tty\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nb,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-breaks=<bool>              "
              << Whitespace(sizePrefixDisplay*1) << "disables breakpoints in debuggers\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "ns,  --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-skip=<bool>                "
              << Whitespace(sizePrefixDisplay*1) << "don't skip test cases marked as skip\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "gfl, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "gnu-file-line=<bool>          "
              << Whitespace(sizePrefixDisplay*1) << ":n: vs (n): for line numbers in output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "npf, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-path-filenames=<bool>      "
              << Whitespace(sizePrefixDisplay*1) << "only filenames and no paths in output\n";
            s << " -" DOCTEST_OPTIONS_PREFIX_DISPLAY "nln, --" DOCTEST_OPTIONS_PREFIX_DISPLAY "no-line-numbers=<bool>        "
              << Whitespace(sizePrefixDisplay*1) << "0 instead of real line numbers in output\n";
            // ================================================================================== << 79
            // clang-format on

            s << Color::Cyan << "\n[doctest] " << Color::None;
            s << "for more information visit the project documentation\n\n";
        }